

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detour.c
# Opt level: O0

int detour_initialize(void)

{
  int iVar1;
  void *in_stack_00001020;
  plugin_manager_interface in_stack_00001028;
  char *in_stack_00001030;
  char *in_stack_00001038;
  char *in_stack_00001040;
  plugin_manager in_stack_00001048;
  
  iVar1 = plugin_manager_initialize
                    (in_stack_00001048,in_stack_00001040,in_stack_00001038,in_stack_00001030,
                     in_stack_00001028,in_stack_00001020);
  return iVar1;
}

Assistant:

int detour_initialize(void)
{
	return plugin_manager_initialize(
		&detour_manager,
		DETOUR_MANAGER_NAME,
		DETOUR_LIBRARY_PATH,
#if defined(DETOUR_LIBRARY_INSTALL_PATH)
		DETOUR_LIBRARY_INSTALL_PATH,
#else
		DETOUR_LIBRARY_DEFAULT_PATH,
#endif /* DETOUR_LIBRARY_INSTALL_PATH */
		NULL,
		NULL);
}